

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

ExecutionResult __thiscall nigel::Preprocessor::onExecute(Preprocessor *this,CodeBase *base)

{
  bool bVar1;
  size_t base_00;
  bool bVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  size_type line;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *this_00;
  __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar5;
  shared_ptr<nigel::CompileNotification> *n;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *__range1;
  undefined1 local_138 [7];
  bool hasError;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  shared_ptr<boost::filesystem::path> local_118;
  allocator local_101;
  key_type local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_89;
  key_type local_88;
  size_t local_68;
  size_t posAtIgnore;
  size_t sStack_58;
  bool ignoreifdef;
  size_t ifdefCount;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  definitions;
  CodeBase *base_local;
  Preprocessor *this_local;
  
  definitions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)base;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&ifdefCount);
  sStack_58 = 0;
  posAtIgnore._7_1_ = 0;
  local_68 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"__PLATFORM__",&local_89);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&ifdefCount,&local_88);
  std::__cxx11::string::operator=((string *)pmVar3,"ATMEL_8051");
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::to_string(&local_e0,1.2);
  std::operator+(&local_c0,"NIGEL_",&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"__COMPILER__",&local_101);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&ifdefCount,&local_100);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  base_00 = definitions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::shared_ptr<boost::filesystem::path>::shared_ptr
            (&local_118,
             (shared_ptr<boost::filesystem::path> *)
             definitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  processFile(this,(CodeBase *)base_00,&local_118,
              (vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_> *
              )(definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28),
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&ifdefCount,&stack0xffffffffffffffa8,(bool *)((long)&posAtIgnore + 7),&local_68);
  std::shared_ptr<boost::filesystem::path>::~shared_ptr(&local_118);
  if (sStack_58 != 0) {
    pvVar4 = std::
             vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
             back((vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   *)(definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28));
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    shared_ptr(&local_128,&pvVar4->content);
    line = std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
           ::size((vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
                   *)(definitions._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x28));
    std::shared_ptr<boost::filesystem::path>::shared_ptr
              ((shared_ptr<boost::filesystem::path> *)local_138,
               (shared_ptr<boost::filesystem::path> *)
               definitions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,err_unclosedIfdef,&local_128,line,
               (shared_ptr<boost::filesystem::path> *)local_138);
    std::shared_ptr<boost::filesystem::path>::~shared_ptr
              ((shared_ptr<boost::filesystem::path> *)local_138);
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr(&local_128);
  }
  bVar1 = false;
  this_00 = &(this->super_BuilderExecutable).notificationList;
  __end1 = std::__cxx11::
           list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
           ::begin(this_00);
  n = (shared_ptr<nigel::CompileNotification> *)
      std::__cxx11::
      list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
      ::end(this_00);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&n);
    if (!bVar2) {
LAB_002675e2:
      if (bVar1) {
        this_local._4_4_ = imParsingFailed;
      }
      else {
        this_local._4_4_ = success;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ifdefCount);
      return this_local._4_4_;
    }
    this_01 = (__shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator*
                           (&__end1);
    peVar5 = std::
             __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_01);
    if ((0 < (int)peVar5->type) &&
       (peVar5 = std::
                 __shared_ptr_access<nigel::CompileNotification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_01), (int)peVar5->type < 0x7fff)) {
      bVar1 = true;
      goto LAB_002675e2;
    }
    std::_List_iterator<std::shared_ptr<nigel::CompileNotification>_>::operator++(&__end1);
  } while( true );
}

Assistant:

ExecutionResult Preprocessor::onExecute( CodeBase & base )
	{
		std::map<String, String> definitions;
		size_t ifdefCount = 0;
		bool ignoreifdef = false;
		size_t posAtIgnore = 0;

		//Default definitions
		definitions["__PLATFORM__"] = "ATMEL_8051";
		definitions["__COMPILER__"] = "NIGEL_" + to_string( NIGEL_VERSION );

		processFile( base, base.srcFile, base.fileCont, definitions, ifdefCount, ignoreifdef, posAtIgnore );

		if( ifdefCount > 0 )
			generateNotification( NT::err_unclosedIfdef, base.fileCont.back().content, base.fileCont.size(), base.srcFile );

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( hasError ) return ExecutionResult::imParsingFailed;
		else return ExecutionResult::success;
	}